

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCatch v",8);
  libraryVersion();
  operator<<((ostream *)&std::cout,&libraryVersion::version);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  clara::detail::Parser::writeToStream(&this->m_cli,(ostream *)&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"For more detailed usage please see the project docs\n",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch v" << libraryVersion() << "\n"
                << m_cli << std::endl
                << "For more detailed usage please see the project docs\n" << std::endl;
    }